

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

bool Assimp::IFC::GenerateOpenings
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh,bool check_intersection,bool generate_connection_geometry,
               IfcVector3 *wall_extrusion_axis)

{
  pointer pvVar1;
  uint uVar2;
  pointer pTVar3;
  element_type *peVar4;
  pointer paVar5;
  pointer paVar6;
  pointer paVar7;
  pointer paVar8;
  pointer pPVar9;
  pointer poly_00;
  bool bVar10;
  aiMatrix4x4t<double> *paVar11;
  aiVector3t<double> *paVar12;
  ulong uVar13;
  undefined7 extraout_var;
  TempMesh *pTVar14;
  long lVar15;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  _Var16;
  undefined4 uVar17;
  IfcVector3 *v3;
  long lVar18;
  long lVar19;
  pointer pVector;
  IfcMatrix4 *pIVar20;
  element_type *__x;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour_00;
  const_iterator __position;
  pointer pTVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  byte bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  bool ok;
  undefined4 local_3d0;
  undefined4 local_3cc;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  ContourVector contours;
  ExPolygons poly;
  pointer local_360;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour2;
  double local_338;
  aiVector3t<double> local_328;
  aiVector2t<double> local_308;
  aiVector2t<double> local_2f8;
  BoundingBox bb;
  OpeningRefVector contours_to_openings;
  vector<unsigned_int,_std::allocator<unsigned_int>_> profile_vertcnts;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> profile_verts;
  aiVector2t<double> local_278;
  aiVector2t<double> local_268;
  IfcVector3 nor;
  vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> joined_openings;
  IfcVector3 wall_extrusion_axis_norm;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcVector3 v;
  double dStack_1a0;
  IfcMatrix4 minv;
  IfcMatrix4 m;
  
  bVar25 = 0;
  contours_to_openings.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours_to_openings.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contours_to_openings.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ok = true;
  contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  contour_flat.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nor.x = 0.0;
  nor.y = 0.0;
  nor.z = 0.0;
  ProjectOntoPlane(&m,&contour_flat,curmesh,&ok,&nor);
  if (ok == false) {
    uVar17 = 0;
  }
  else {
    pIVar20 = &m;
    paVar11 = (aiMatrix4x4t<double> *)&v;
    for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
      paVar11->a1 = pIVar20->a1;
      pIVar20 = (IfcMatrix4 *)((long)pIVar20 + (ulong)bVar25 * -0x10 + 8);
      paVar11 = (aiMatrix4x4t<double> *)((long)paVar11 + (ulong)bVar25 * -0x10 + 8);
    }
    paVar11 = aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)&v);
    pIVar20 = &minv;
    for (_Var16._M_current = (TempOpening **)0x10; (pointer)_Var16._M_current != (pointer)0x0;
        _Var16._M_current =
             (TempOpening **)
             ((long)&(((pointer)((long)_Var16._M_current + -0x30))->holes).
                     super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      pIVar20->a1 = paVar11->a1;
      paVar11 = (aiMatrix4x4t<double> *)((long)paVar11 + (ulong)bVar25 * -0x10 + 8);
      pIVar20 = (IfcMatrix4 *)((long)pIVar20 + (ulong)bVar25 * -0x10 + 8);
    }
    contours.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contours.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contours.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wall_extrusion_axis_norm.z = wall_extrusion_axis->z;
    wall_extrusion_axis_norm.x = wall_extrusion_axis->x;
    wall_extrusion_axis_norm.y = wall_extrusion_axis->y;
    aiVector3t<double>::Normalize(&wall_extrusion_axis_norm);
    pTVar21 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (openings->
             super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_3cc = SUB84(pTVar3,0);
LAB_004f9a23:
    if (pTVar21 != pTVar3) {
      local_328.x = (pTVar21->extrusionDir).x;
      local_328.y = (pTVar21->extrusionDir).y;
      local_328.z = (pTVar21->extrusionDir).z;
      if (local_328.z * local_328.z + local_328.x * local_328.x + local_328.y * local_328.y <= 1e-10
         ) {
        local_328.x = 0.0;
        local_328.y = 0.0;
        local_328.z = 0.0;
      }
      else {
        aiVector3t<double>::Normalize(&local_328);
      }
      __x = (pTVar21->profileMesh).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4 = (pTVar21->profileMesh2D).
               super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3d0 = (undefined4)CONCAT71((int7)((ulong)_Var16._M_current >> 8),1);
      if (((peVar4 != (element_type *)0x0) &&
          (0.0 < local_328.z * local_328.z + local_328.x * local_328.x + local_328.y * local_328.y))
         && (0.9 < ABS(local_328.z * nor.z + local_328.x * nor.x + local_328.y * nor.y))) {
        local_3d0 = 0;
        __x = peVar4;
      }
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                (&profile_verts,&__x->mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&profile_vertcnts,&__x->mVertcnt);
      _Var16._M_current = (TempOpening **)0x0;
      if (2 < (ulong)(((long)profile_verts.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)profile_verts.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        if (temp_contour.
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            temp_contour.
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               temp_contour.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (temp_contour2.
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            temp_contour2.
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               temp_contour2.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        lVar15 = (long)profile_vertcnts.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)profile_vertcnts.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        local_360 = (pointer)0xc202a05f20000000;
        local_338 = 10000000000.0;
        lVar19 = 0;
        local_308.y = 10000000000.0;
        local_308.x = 10000000000.0;
        local_268.y = 10000000000.0;
        local_268.x = 10000000000.0;
        local_2f8.y = -10000000000.0;
        local_2f8.x = -10000000000.0;
        local_278.y = -10000000000.0;
        local_278.x = -10000000000.0;
        for (lVar22 = 0;
            _Var16._M_current =
                 (TempOpening **)
                 temp_contour2.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
            paVar8 = temp_contour.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
            paVar7 = temp_contour.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
            paVar6 = temp_contour.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start, lVar22 != lVar15 >> 2;
            lVar22 = lVar22 + 1) {
          bVar24 = true;
          if ((byte)local_3d0 == 0) {
LAB_004f9d7d:
            uVar2 = profile_vertcnts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar22];
            lVar18 = lVar19 * 0x18;
            for (lVar23 = 0; -uVar2 != (int)lVar23; lVar23 = lVar23 + -1) {
              ::operator*(&m,(aiVector3t<double> *)
                             ((long)&(profile_verts.
                                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->x + lVar18));
              pvVar1 = (pointer)v.z;
              auVar27._8_8_ = v.y;
              auVar27._0_8_ = v.x;
              auVar27 = maxpd(ZEXT816(0),auVar27);
              bb.first = (aiVector2t<double>)minpd(_DAT_005fc4f0,auVar27);
              if (bVar24) {
                local_308 = (aiVector2t<double>)
                            minpd((undefined1  [16])bb.first,(undefined1  [16])local_308);
                local_2f8 = (aiVector2t<double>)
                            maxpd((undefined1  [16])bb.first,(undefined1  [16])local_2f8);
                temp_contour_00 = &temp_contour;
              }
              else {
                local_268 = (aiVector2t<double>)
                            minpd((undefined1  [16])bb.first,(undefined1  [16])local_268);
                local_278 = (aiVector2t<double>)
                            maxpd((undefined1  [16])bb.first,(undefined1  [16])local_278);
                temp_contour_00 = &temp_contour2;
              }
              bVar10 = IsDuplicateVertex(&bb.first,temp_contour_00);
              if (!bVar10) {
                std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::push_back
                          (temp_contour_00,&bb.first);
              }
              dVar28 = (double)pvVar1;
              if (local_338 <= (double)pvVar1) {
                dVar28 = local_338;
              }
              if ((double)pvVar1 <= (double)local_360) {
                pvVar1 = local_360;
              }
              lVar18 = lVar18 + 0x18;
              local_360 = pvVar1;
              local_338 = dVar28;
            }
            uVar13 = -lVar23;
          }
          else {
            dVar26 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19 + 2].x -
                     profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19].x;
            dVar28 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19].y;
            dVar31 = (&profile_verts.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar19].y)[1];
            dVar29 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19 + 2].y - dVar28;
            dVar30 = (&profile_verts.
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar19 + 2].y)[1] - dVar31;
            dVar28 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19 + 1].y - dVar28;
            dVar31 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19 + 1].z - dVar31;
            dVar32 = profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19 + 1].x -
                     profile_verts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar19].x;
            v.x = dVar29 * dVar31 - dVar28 * dVar30;
            v.y = dVar30 * dVar32 - dVar31 * dVar26;
            v.z = dVar26 * dVar28 - dVar32 * dVar29;
            paVar12 = aiVector3t<double>::Normalize((aiVector3t<double> *)&v);
            dVar28 = paVar12->y * nor.y + nor.x * paVar12->x + nor.z * paVar12->z;
            if (0.9 <= ABS(dVar28)) {
              bVar24 = 0.0 < dVar28;
              goto LAB_004f9d7d;
            }
            uVar13 = (ulong)profile_vertcnts.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar22];
          }
          lVar19 = lVar19 + uVar13;
        }
        if ((ulong)((long)temp_contour2.
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)temp_contour2.
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          if ((ulong)((long)temp_contour.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)temp_contour.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_004fa083;
        }
        else {
          if ((byte)local_3d0 == 0) {
            __assert_fail("!is_2d_source",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x508,
                          "bool Assimp::IFC::GenerateOpenings(std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &, bool, bool, const IfcVector3 &)"
                         );
          }
          if (0x20 < (ulong)((long)temp_contour.
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)temp_contour.
                                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            if (ABS((local_278.x - local_268.x) * (local_278.y - local_268.y)) <=
                ABS((local_2f8.x - local_308.x) * (local_2f8.y - local_308.y))) goto LAB_004f9fed;
          }
          temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               temp_contour2.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
          temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               temp_contour2.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               temp_contour2.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = paVar6;
          temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = paVar7;
          temp_contour2.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = paVar8;
          local_308 = local_268;
          local_2f8 = local_278;
        }
LAB_004f9fed:
        if ((((byte)local_3d0 & check_intersection) != 1) ||
           ((dVar28 = ABS((double)local_360 - local_338) * 0.0001, local_338 <= dVar28 &&
            (0.0 <= (double)local_360 + dVar28)))) {
          bb.first = local_308;
          bb.second = local_2f8;
          if (1e-10 <= ABS((local_2f8.y - local_308.y) * (local_2f8.x - local_308.x))) {
            _Var16._M_current = (TempOpening **)&poly;
            v.x = (double)pTVar21;
            std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
            vector(&joined_openings,1,(value_type *)&v,(allocator_type *)_Var16._M_current);
            bVar24 = (long)temp_contour.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)temp_contour.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x40;
            __position._M_current =
                 contours.
                 super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            do {
              pPVar9 = contours.
                       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              lVar15 = -(long)__position._M_current;
              while( true ) {
                if (__position._M_current == pPVar9) goto LAB_004fa332;
                bVar10 = BoundingBoxesOverlapping(&(__position._M_current)->bb,&bb);
                if (bVar10) break;
                __position._M_current = __position._M_current + 1;
                lVar15 = lVar15 + -0x68;
              }
              bVar24 = (bool)(bVar24 & (__position._M_current)->is_rectangular);
              poly.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              poly.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              poly.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              MakeDisjunctWindowContours(&(__position._M_current)->contour,&temp_contour,&poly);
              poly_00 = poly.
                        super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((long)poly.
                        super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)poly.
                        super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x30) {
                GetBoundingBox(&(poly.
                                 super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->outer);
                bVar10 = BoundingBoxesOverlapping(&(__position._M_current)->bb,(BoundingBox *)&v);
                if (bVar10) goto LAB_004fa17d;
                bb.first.y = v.y;
                bb.first.x = v.x;
                bb.second.y = dStack_1a0;
                bb.second.x = v.z;
                ExtractVerticesFromClipper(&poly_00->outer,&temp_contour,false);
              }
              else {
LAB_004fa17d:
                MergeWindowContours(&temp_contour,&(__position._M_current)->contour,&poly);
                _Var16._M_current =
                     (TempOpening **)
                     poly.
                     super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (1 < (ulong)(((long)poly.
                                       super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)poly.
                                      super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
                  bVar24 = TryAddOpenings_Poly2Tri(openings,nors,curmesh);
                  local_3cc = (undefined4)CONCAT71(extraout_var,bVar24);
                  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
                  ~vector(&poly);
                  bVar10 = false;
                  goto LAB_004fa3ad;
                }
                if (poly.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    poly.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_start) goto LAB_004fa306;
                LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4fa1c6);
                ExtractVerticesFromClipper
                          (&(poly.
                             super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                             ._M_impl.super__Vector_impl_data._M_start)->outer,&temp_contour,false);
                bb.first = (aiVector2t<double>)
                           minpd((undefined1  [16])((__position._M_current)->bb).first,
                                 (undefined1  [16])bb.first);
                bb.second = (aiVector2t<double>)
                            maxpd((undefined1  [16])((__position._M_current)->bb).second,
                                  (undefined1  [16])bb.second);
                if (generate_connection_geometry) {
                  lVar19 = -((long)&((contours.
                                      super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->contour).
                                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar15) / 0x68;
                  _Var16._M_current =
                       contours_to_openings.
                       super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar19].
                       super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
                  insert<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                            ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                              *)&joined_openings,
                             (const_iterator)
                             joined_openings.
                             super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                              )contours_to_openings.
                               super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar19].
                               super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,_Var16);
                  std::
                  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                  ::erase(&contours_to_openings,
                          contours_to_openings.
                          super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          -((long)&((contours.
                                     super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->contour).
                                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar15) / 0x68);
                }
                std::
                vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                ::erase(&contours,__position);
                __position._M_current =
                     contours.
                     super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
                        (&poly);
            } while( true );
          }
        }
      }
LAB_004fa083:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&profile_vertcnts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
                (&profile_verts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
      goto LAB_004fa09d;
    }
    if (contours.
        super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        contours.
        super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_3cc = 0;
    }
    else {
      TempMesh::Clear(curmesh);
      pTVar14 = curmesh;
      Quadrify(&contours,curmesh);
      CleanupWindowContours(&contours);
      InsertWindowContours
                (&contours,
                 (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                 pTVar14,curmesh);
      CleanupOuterContour(&contour_flat,curmesh);
      paVar5 = (curmesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar14 = curmesh;
      for (pVector = (curmesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; pVector != paVar5;
          pVector = pVector + 1) {
        ::operator*(&minv,pVector);
        pVector->z = v.z;
        pVector->x = v.x;
        pVector->y = v.y;
        pTVar14 = (TempMesh *)v.z;
      }
      local_3cc = (undefined4)CONCAT71((int7)((ulong)pTVar14 >> 8),1);
      if (generate_connection_geometry) {
        CloseWindows(&contours,&minv,&contours_to_openings,curmesh);
      }
    }
LAB_004fa4c0:
    std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
              (&temp_contour2.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
    std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
              (&temp_contour.
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
    std::
    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ::~vector(&contours);
    uVar17 = local_3cc;
  }
  std::_Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::~_Vector_base
            (&contour_flat.
              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>);
  std::
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ::~vector(&contours_to_openings);
  return (bool)((byte)uVar17 & 1);
LAB_004fa306:
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4fa312);
  if (temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&poly);
LAB_004fa332:
  bVar10 = true;
  if (temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      temp_contour.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (generate_connection_geometry) {
      std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
      vector<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>> *)&v,
                 (__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                  )joined_openings.
                   super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                  )joined_openings.
                   super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&poly);
      std::
      vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
      ::
      emplace_back<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>
                ((vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                  *)&contours_to_openings,
                 (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> *)
                 &v);
      std::_Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
      ~_Vector_base((_Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                     *)&v);
    }
    _Var16._M_current = (TempOpening **)0x0;
    ProjectedWindowContour::ProjectedWindowContour
              ((ProjectedWindowContour *)&v,&temp_contour,&bb,bVar24);
    std::
    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ::emplace_back<Assimp::IFC::ProjectedWindowContour>(&contours,(ProjectedWindowContour *)&v);
    ProjectedWindowContour::~ProjectedWindowContour((ProjectedWindowContour *)&v);
  }
LAB_004fa3ad:
  std::_Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
  ~_Vector_base(&joined_openings.
                 super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
               );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&profile_vertcnts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~_Vector_base
            (&profile_verts.
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>);
  if (!bVar10) goto LAB_004fa4c0;
LAB_004fa09d:
  pTVar21 = pTVar21 + 1;
  goto LAB_004f9a23;
}

Assistant:

bool GenerateOpenings(std::vector<TempOpening>& openings,
    const std::vector<IfcVector3>& nors,
    TempMesh& curmesh,
    bool check_intersection,
    bool generate_connection_geometry,
    const IfcVector3& wall_extrusion_axis)
{
    OpeningRefVector contours_to_openings;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system. Map all vertices onto this plane and
    // rescale them to [0,1] range. This normalization means all further
    // epsilons need not be scaled.
    bool ok = true;

    std::vector<IfcVector2> contour_flat;

    IfcVector3 nor;
    const IfcMatrix4 m = ProjectOntoPlane(contour_flat, curmesh,  ok, nor);
    if(!ok) {
        return false;
    }

    // Obtain inverse transform for getting back to world space later on
    const IfcMatrix4 minv = IfcMatrix4(m).Inverse();

    // Compute bounding boxes for all 2D openings in projection space
    ContourVector contours;

    std::vector<IfcVector2> temp_contour;
    std::vector<IfcVector2> temp_contour2;

    IfcVector3 wall_extrusion_axis_norm = wall_extrusion_axis;
    wall_extrusion_axis_norm.Normalize();

    for(TempOpening& opening :openings) {

        // extrusionDir may be 0,0,0 on case where the opening mesh is not an
        // IfcExtrudedAreaSolid but something else (i.e. a brep)
        IfcVector3 norm_extrusion_dir = opening.extrusionDir;
        if (norm_extrusion_dir.SquareLength() > 1e-10) {
            norm_extrusion_dir.Normalize();
        }
        else {
            norm_extrusion_dir = IfcVector3();
        }

        TempMesh* profile_data =  opening.profileMesh.get();
        bool is_2d_source = false;
        if (opening.profileMesh2D && norm_extrusion_dir.SquareLength() > 0) {

            if(std::fabs(norm_extrusion_dir * wall_extrusion_axis_norm) < 0.1) {
                // horizontal extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
            else {
                // vertical extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
        }
        std::vector<IfcVector3> profile_verts = profile_data->mVerts;
        std::vector<unsigned int> profile_vertcnts = profile_data->mVertcnt;
        if(profile_verts.size() <= 2) {
            continue;
        }

        // The opening meshes are real 3D meshes so skip over all faces
        // clearly facing into the wrong direction. Also, we need to check
        // whether the meshes do actually intersect the base surface plane.
        // This is done by recording minimum and maximum values for the
        // d component of the plane equation for all polys and checking
        // against surface d.

        // Use the sign of the dot product of the face normal to the plane
        // normal to determine to which side of the difference mesh a
        // triangle belongs. Get independent bounding boxes and vertex
        // sets for both sides and take the better one (we can't just
        // take both - this would likely cause major screwup of vertex
        // winding, producing errors as late as in CloseWindows()).
        IfcFloat dmin, dmax;
        MinMaxChooser<IfcFloat>()(dmin,dmax);

        temp_contour.clear();
        temp_contour2.clear();

        IfcVector2 vpmin,vpmax;
        MinMaxChooser<IfcVector2>()(vpmin,vpmax);

        IfcVector2 vpmin2,vpmax2;
        MinMaxChooser<IfcVector2>()(vpmin2,vpmax2);

        for (size_t f = 0, vi_total = 0, fend = profile_vertcnts.size(); f < fend; ++f) {

            bool side_flag = true;
            if (!is_2d_source) {
                const IfcVector3 face_nor = ((profile_verts[vi_total+2] - profile_verts[vi_total]) ^
                    (profile_verts[vi_total+1] - profile_verts[vi_total])).Normalize();

                const IfcFloat abs_dot_face_nor = std::abs(nor * face_nor);
                if (abs_dot_face_nor < 0.9) {
                    vi_total += profile_vertcnts[f];
                    continue;
                }

                side_flag = nor * face_nor > 0;
            }

            for (unsigned int vi = 0, vend = profile_vertcnts[f]; vi < vend; ++vi, ++vi_total) {
                const IfcVector3& x = profile_verts[vi_total];

                const IfcVector3 v = m * x;
                IfcVector2 vv(v.x, v.y);

                //if(check_intersection) {
                    dmin = std::min(dmin, v.z);
                    dmax = std::max(dmax, v.z);
                //}

                // sanity rounding
                vv = std::max(vv,IfcVector2());
                vv = std::min(vv,one_vec);

                if(side_flag) {
                    vpmin = std::min(vpmin,vv);
                    vpmax = std::max(vpmax,vv);
                }
                else {
                    vpmin2 = std::min(vpmin2,vv);
                    vpmax2 = std::max(vpmax2,vv);
                }

                std::vector<IfcVector2>& store = side_flag ? temp_contour : temp_contour2;

                if (!IsDuplicateVertex(vv, store)) {
                    store.push_back(vv);
                }
            }
        }

        if (temp_contour2.size() > 2) {
            ai_assert(!is_2d_source);
            const IfcVector2 area = vpmax-vpmin;
            const IfcVector2 area2 = vpmax2-vpmin2;
            if (temp_contour.size() <= 2 || std::fabs(area2.x * area2.y) > std::fabs(area.x * area.y)) {
                temp_contour.swap(temp_contour2);

                vpmax = vpmax2;
                vpmin = vpmin2;
            }
        }
        if(temp_contour.size() <= 2) {
            continue;
        }

        // TODO: This epsilon may be too large
        const IfcFloat epsilon = std::fabs(dmax-dmin) * 0.0001;
        if (!is_2d_source && check_intersection && (0 < dmin-epsilon || 0 > dmax+epsilon)) {
            continue;
        }

        BoundingBox bb = BoundingBox(vpmin,vpmax);

        // Skip over very small openings - these are likely projection errors
        // (i.e. they don't belong to this side of the wall)
        if(std::fabs(vpmax.x - vpmin.x) * std::fabs(vpmax.y - vpmin.y) < static_cast<IfcFloat>(1e-10)) {
            continue;
        }
        std::vector<TempOpening*> joined_openings(1, &opening);

        bool is_rectangle = temp_contour.size() == 4;

        // See if this BB intersects or is in close adjacency to any other BB we have so far.
        for (ContourVector::iterator it = contours.begin(); it != contours.end(); ) {
            const BoundingBox& ibb = (*it).bb;

            if (BoundingBoxesOverlapping(ibb, bb)) {

                if (!(*it).is_rectangular) {
                    is_rectangle = false;
                }

                const std::vector<IfcVector2>& other = (*it).contour;
                ClipperLib::ExPolygons poly;

                // First check whether subtracting the old contour (to which ibb belongs)
                // from the new contour (to which bb belongs) yields an updated bb which
                // no longer overlaps ibb
                MakeDisjunctWindowContours(other, temp_contour, poly);
                if(poly.size() == 1) {

                    const BoundingBox newbb = GetBoundingBox(poly[0].outer);
                    if (!BoundingBoxesOverlapping(ibb, newbb )) {
                         // Good guy bounding box
                         bb = newbb ;

                         ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);
                         continue;
                    }
                }

                // Take these two overlapping contours and try to merge them. If they
                // overlap (which should not happen, but in fact happens-in-the-real-
                // world [tm] ), resume using a single contour and a single bounding box.
                MergeWindowContours(temp_contour, other, poly);

                if (poly.size() > 1) {
                    return TryAddOpenings_Poly2Tri(openings, nors, curmesh);
                }
                else if (poly.size() == 0) {
                    IFCImporter::LogWarn("ignoring duplicate opening");
                    temp_contour.clear();
                    break;
                }
                else {
                    IFCImporter::LogDebug("merging overlapping openings");
                    ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);

                    // Generate the union of the bounding boxes
                    bb.first = std::min(bb.first, ibb.first);
                    bb.second = std::max(bb.second, ibb.second);

                    // Update contour-to-opening tables accordingly
                    if (generate_connection_geometry) {
                        std::vector<TempOpening*>& t = contours_to_openings[std::distance(contours.begin(),it)];
                        joined_openings.insert(joined_openings.end(), t.begin(), t.end());

                        contours_to_openings.erase(contours_to_openings.begin() + std::distance(contours.begin(),it));
                    }

                    contours.erase(it);

                    // Restart from scratch because the newly formed BB might now
                    // overlap any other BB which its constituent BBs didn't
                    // previously overlap.
                    it = contours.begin();
                    continue;
                }
            }
            ++it;
        }

        if(!temp_contour.empty()) {
            if (generate_connection_geometry) {
                contours_to_openings.push_back(std::vector<TempOpening*>(
                    joined_openings.begin(),
                    joined_openings.end()));
            }

            contours.push_back(ProjectedWindowContour(temp_contour, bb, is_rectangle));
        }
    }

    // Check if we still have any openings left - it may well be that this is
    // not the cause, for example if all the opening candidates don't intersect
    // this surface or point into a direction perpendicular to it.
    if (contours.empty()) {
        return false;
    }

    curmesh.Clear();

    // Generate a base subdivision into quads to accommodate the given list
    // of window bounding boxes.
    Quadrify(contours,curmesh);

    // Run a sanity cleanup pass on the window contours to avoid generating
    // artifacts during the contour generation phase later on.
    CleanupWindowContours(contours);

    // Previously we reduced all windows to rectangular AABBs in projection
    // space, now it is time to fill the gaps between the BBs and the real
    // window openings.
    InsertWindowContours(contours,openings, curmesh);

    // Clip the entire outer contour of our current result against the real
    // outer contour of the surface. This is necessary because the result
    // of the Quadrify() algorithm is always a square area spanning
    // over [0,1]^2 (i.e. entire projection space).
    CleanupOuterContour(contour_flat, curmesh);

    // Undo the projection and get back to world (or local object) space
    for(IfcVector3& v3 : curmesh.mVerts) {
        v3 = minv * v3;
    }

    // Generate window caps to connect the symmetric openings on both sides
    // of the wall.
    if (generate_connection_geometry) {
        CloseWindows(contours, minv, contours_to_openings, curmesh);
    }
    return true;
}